

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializeToArray(MessageLite *this,void *data,int size)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  MessageLite *message;
  LogFinisher local_79;
  string local_78;
  LogMessage local_58;
  
  iVar2 = (*this->_vptr_MessageLite[5])();
  if ((char)iVar2 == '\0') {
    message = (MessageLite *)0x1d9;
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x1d9);
    pLVar3 = internal::LogMessage::operator<<(&local_58,"CHECK failed: IsInitialized(): ");
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)0x3ef213,(char *)this,message);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,&local_78);
    internal::LogFinisher::operator=(&local_79,pLVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    internal::LogMessage::~LogMessage(&local_58);
  }
  bVar1 = SerializePartialToArray(this,data,size);
  return bVar1;
}

Assistant:

bool MessageLite::SerializeToArray(void* data, int size) const {
  GOOGLE_DCHECK(IsInitialized()) << InitializationErrorMessage("serialize", *this);
  return SerializePartialToArray(data, size);
}